

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portability_atexit.c
# Opt level: O3

int portability_atexit_initialize(void)

{
  if ((atexit_list == (atexit_node_type *)0x0) &&
     (atexit_list = (atexit_node_type *)calloc(1,0x10), atexit_list == (atexit_node_type *)0x0)) {
    return 1;
  }
  if (portability_atexit_initialize_atexit_registered == '\0') {
    atexit(portability_atexit_destroy);
    portability_atexit_initialize_atexit_registered = '\x01';
  }
  return 0;
}

Assistant:

int portability_atexit_initialize(void)
{
	static int atexit_registered = 0;

	if (atexit_list == NULL)
	{
		atexit_list = malloc(sizeof(struct atexit_node_type));

		if (atexit_list == NULL)
		{
			return 1;
		}

		atexit_list->handler = NULL;
		atexit_list->next = NULL;
	}

	if (atexit_registered == 0)
	{
		atexit(&portability_atexit_destroy);
		atexit_registered = 1;
	}

	return 0;
}